

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__jpg_calcBits(int val,unsigned_short *bits)

{
  int local_1c;
  int local_18;
  int tmp1;
  unsigned_short *bits_local;
  int val_local;
  
  local_18 = val;
  if (val < 0) {
    local_18 = -val;
  }
  tmp1 = local_18;
  local_1c = val;
  if (val < 0) {
    local_1c = val + -1;
  }
  bits[1] = 1;
  while (tmp1 = tmp1 >> 1, tmp1 != 0) {
    bits[1] = bits[1] + 1;
  }
  *bits = (ushort)local_1c & (short)(1 << ((byte)bits[1] & 0x1f)) - 1U;
  return;
}

Assistant:

static void stbiw__jpg_calcBits(int val, unsigned short bits[2]) {
   int tmp1 = val < 0 ? -val : val;
   val = val < 0 ? val-1 : val;
   bits[1] = 1;
   while(tmp1 >>= 1) {
      ++bits[1];
   }
   bits[0] = val & ((1<<bits[1])-1);
}